

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O3

prng * prng_new(ssh_hashalg *hashalg)

{
  prng *__s;
  long *plVar1;
  long lVar2;
  
  __s = (prng *)safemalloc(1,0x1a8,0);
  memset(__s,0,0x1a8);
  __s[1].savesize = (size_t)hashalg;
  __s[1].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
  __s[1].binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  __s[1].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  __s[2].savesize = 0;
  lVar2 = 0x12;
  do {
    plVar1 = (long *)(**(code **)__s[1].savesize)();
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))(plVar1);
    }
    *(long **)((long)__s->binarysink_ + lVar2 * 8 + -8) = plVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x32);
  __s[0xc].binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  __s->binarysink_[0].write = prng_seed_BinarySink_write;
  __s->binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  __s->binarysink_[0].binarysink_ = __s->binarysink_;
  __s->savesize = *(long *)(__s[1].savesize + 0x28) << 2;
  return __s;
}

Assistant:

prng *prng_new(const ssh_hashalg *hashalg)
{
    prng_impl *pi = snew(prng_impl);

    memset(pi, 0, sizeof(prng_impl));
    pi->hashalg = hashalg;
    pi->keymaker = NULL;
    pi->generator = NULL;
    memset(pi->counter, 0, sizeof(pi->counter));
    for (size_t i = 0; i < NCOLLECTORS; i++)
        pi->collectors[i] = ssh_hash_new(pi->hashalg);
    pi->until_reseed = 0;
    BinarySink_INIT(&pi->Prng, prng_seed_BinarySink_write);

    pi->Prng.savesize = pi->hashalg->hlen * 4;

    return &pi->Prng;
}